

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_change_event_remove_ntoh_u16_Test::TestBody(Buffer_change_event_remove_ntoh_u16_Test *this)

{
  initializer_list<bfy_changed_cb_info> __l;
  bool bVar1;
  size_t sVar2;
  char *message;
  AssertHelper local_160;
  Message local_158;
  allocator<bfy_changed_cb_info> local_149;
  bfy_changed_cb_info local_148;
  iterator local_130;
  size_type local_128;
  vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> local_120;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  bfy_changed_cb_info expected;
  BufferWithReadonlyStrings local;
  Buffer_change_event_remove_ntoh_u16_Test *this_local;
  
  local.changes.super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)&expected.n_deleted);
  sVar2 = bfy_buffer_get_content_len((bfy_buffer *)&expected.n_deleted);
  expected.orig_size = 0;
  expected.n_added = 2;
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::start_listening_to_changes
            ((BufferWithReadonlyStrings *)&expected.n_deleted);
  bfy_buffer_remove_ntoh_u16((bfy_buffer *)&expected.n_deleted);
  local_148.n_deleted = expected.n_added;
  local_148.n_added = expected.orig_size;
  local_130 = &local_148;
  local_128 = 1;
  local_148.orig_size = sVar2;
  std::allocator<bfy_changed_cb_info>::allocator(&local_149);
  __l._M_len = local_128;
  __l._M_array = local_130;
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::vector
            (&local_120,__l,&local_149);
  testing::internal::EqHelper::
  Compare<std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>,_std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>,_nullptr>
            ((EqHelper *)local_108,"changes_t{expected}","local.changes",&local_120,
             (vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)
             ((long)&local.allstrs.field_2 + 8));
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::~vector(&local_120);
  std::allocator<bfy_changed_cb_info>::~allocator(&local_149);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x617,message);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)&expected.n_deleted);
  return;
}

Assistant:

TEST(Buffer, change_event_remove_ntoh_u16) {
    BufferWithReadonlyStrings local;
    auto const expected = bfy_changed_cb_info {
        .orig_size = bfy_buffer_get_content_len(&local.buf),
        .n_added = 0,
        .n_deleted = sizeof(uint16_t)
    };

    local.start_listening_to_changes();
    bfy_buffer_remove_ntoh_u16(&local.buf);
    EXPECT_EQ(changes_t{expected}, local.changes);
}